

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::BuildReg2Aux(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  RegSlot dstRegSlot;
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  OpLayoutReg2Aux *pOVar5;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  RegOpnd *src1Opnd;
  AddrOpnd *src2Opnd;
  RegOpnd *dstOpnd;
  Instr *instr;
  
  bVar3 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x15bc,"(!OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "!OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) goto LAB_004cedab;
    *puVar4 = 0;
  }
  pOVar5 = Js::ByteCodeReader::Reg2Aux(&this->m_jnReader);
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,ClosureRegCheckPhase,sourceContextId,functionId);
  if (!bVar3) {
    DoClosureRegCheck(this,(pOVar5->super_OpLayoutAuxiliary).R0);
    DoClosureRegCheck(this,pOVar5->R1);
  }
  if (newOpcode == SpreadArrayLiteral) {
    dstRegSlot = (pOVar5->super_OpLayoutAuxiliary).R0;
    src1Opnd = BuildSrcOpnd(this,pOVar5->R1,TyVar);
    src2Opnd = BuildAuxArrayOpnd(this,AuxIntArray,
                                 (pOVar5->super_OpLayoutAuxiliary).super_OpLayoutAuxNoReg.Offset);
    dstOpnd = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
    instr = IR::Instr::New(SpreadArrayLiteral,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,
                           &src2Opnd->super_Opnd,this->m_func);
    AddInstr(this,instr,0xffffffff);
    uVar1 = *(uint *)&dstOpnd->m_sym->field_0x18;
    if ((uVar1 & 1) != 0) {
      *(uint *)&dstOpnd->m_sym->field_0x18 = uVar1 | 2;
    }
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                     ,0x15e4,"((0))","Unknown Reg2Aux opcode");
  if (bVar3) {
    *puVar4 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_004cedab:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void
IRBuilder::BuildReg2Aux(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::HasMultiSizeLayout(newOpcode));

    const unaligned Js::OpLayoutReg2Aux *auxInsn = m_jnReader.Reg2Aux();

    if (!PHASE_OFF(Js::ClosureRegCheckPhase, m_func))
    {
        this->DoClosureRegCheck(auxInsn->R0);
        this->DoClosureRegCheck(auxInsn->R1);
    }

    IR::Instr *instr;

    switch (newOpcode)
    {
    case Js::OpCode::SpreadArrayLiteral:
        {
            IR::RegOpnd *   dstOpnd;
            IR::RegOpnd *   src1Opnd;
            IR::Opnd*       src2Opnd;

            Js::RegSlot     dstRegSlot = auxInsn->R0;
            Js::RegSlot     srcRegSlot = auxInsn->R1;

            src1Opnd = this->BuildSrcOpnd(srcRegSlot);

            src2Opnd = this->BuildAuxArrayOpnd(AuxArrayValue::AuxIntArray, auxInsn->Offset);
            dstOpnd = this->BuildDstOpnd(dstRegSlot);

            instr = IR::Instr::New(Js::OpCode::SpreadArrayLiteral, dstOpnd, src1Opnd, src2Opnd, m_func);
            this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

            if (dstOpnd->m_sym->m_isSingleDef)
            {
                dstOpnd->m_sym->m_isNotNumber = true;
            }
            break;
        }

    default:
        {
            AssertMsg(UNREACHED, "Unknown Reg2Aux opcode");
            Fatal();
            break;
        }
    }
}